

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_mul_mipsel(float64 a,float64 b,float_status *s)

{
  int iVar1;
  float64 fVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  
  bVar3 = s->float_exception_flags;
  if (((bVar3 & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      bVar4 = (a & 0x7ff0000000000000) == 0;
      bVar5 = (a & 0x7fffffffffffffff) != 0;
      if (bVar5 && bVar4) {
        a = a & 0x8000000000000000;
        bVar3 = bVar3 | 0x40;
      }
      bVar6 = (b & 0x7ff0000000000000) == 0;
      bVar7 = (b & 0x7fffffffffffffff) != 0;
      if (bVar7 && bVar6) {
        b = b & 0x8000000000000000;
        bVar3 = bVar3 | 0x40;
      }
      if (bVar5 && bVar4 || bVar7 && bVar6) {
        s->float_exception_flags = bVar3;
      }
    }
    iVar1 = __fpclassify((double)a);
    if ((iVar1 == 4) || (iVar1 == 2)) {
      iVar1 = __fpclassify((double)b);
      if ((iVar1 == 4) || (iVar1 == 2)) {
        if ((ABS((double)a) == 0.0) || (ABS((double)b) == 0.0)) {
          dVar8 = (double)((b ^ a) & 0x8000000000000000);
        }
        else {
          dVar8 = (double)a * (double)b;
          if (ABS(dVar8) == INFINITY) {
            s->float_exception_flags = bVar3 | 8;
          }
          else if (ABS(dVar8) <= 2.2250738585072014e-308) goto LAB_007be35e;
        }
        return (float64)dVar8;
      }
    }
  }
LAB_007be35e:
  fVar2 = soft_f64_mul(a,b,s);
  return fVar2;
}

Assistant:

float64 QEMU_FLATTEN
float64_mul(float64 a, float64 b, float_status *s)
{
    return float64_gen2(a, b, s, hard_f64_mul, soft_f64_mul,
                        f64_is_zon2, NULL, f64_mul_fast_test, f64_mul_fast_op);
}